

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# serialize_logical_operator.cpp
# Opt level: O2

unique_ptr<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>,_true> __thiscall
duckdb::LogicalAnyJoin::Deserialize(LogicalAnyJoin *this,Deserializer *deserializer)

{
  JoinType type;
  LogicalAnyJoin *this_00;
  pointer pLVar1;
  pointer *__ptr;
  _Head_base<0UL,_duckdb::LogicalAnyJoin_*,_false> local_28;
  
  type = Deserializer::ReadProperty<duckdb::JoinType>(deserializer,200,"join_type");
  this_00 = (LogicalAnyJoin *)operator_new(0xc0);
  LogicalAnyJoin(this_00,type);
  local_28._M_head_impl = this_00;
  pLVar1 = unique_ptr<duckdb::LogicalAnyJoin,_std::default_delete<duckdb::LogicalAnyJoin>,_true>::
           operator->((unique_ptr<duckdb::LogicalAnyJoin,_std::default_delete<duckdb::LogicalAnyJoin>,_true>
                       *)&local_28);
  Deserializer::ReadPropertyWithDefault<unsigned_long>
            (deserializer,0xc9,"mark_index",&(pLVar1->super_LogicalJoin).mark_index);
  pLVar1 = unique_ptr<duckdb::LogicalAnyJoin,_std::default_delete<duckdb::LogicalAnyJoin>,_true>::
           operator->((unique_ptr<duckdb::LogicalAnyJoin,_std::default_delete<duckdb::LogicalAnyJoin>,_true>
                       *)&local_28);
  Deserializer::ReadPropertyWithDefault<duckdb::vector<unsigned_long,true>>
            (deserializer,0xca,"left_projection_map",
             &(pLVar1->super_LogicalJoin).left_projection_map);
  pLVar1 = unique_ptr<duckdb::LogicalAnyJoin,_std::default_delete<duckdb::LogicalAnyJoin>,_true>::
           operator->((unique_ptr<duckdb::LogicalAnyJoin,_std::default_delete<duckdb::LogicalAnyJoin>,_true>
                       *)&local_28);
  Deserializer::ReadPropertyWithDefault<duckdb::vector<unsigned_long,true>>
            (deserializer,0xcb,"right_projection_map",
             &(pLVar1->super_LogicalJoin).right_projection_map);
  pLVar1 = unique_ptr<duckdb::LogicalAnyJoin,_std::default_delete<duckdb::LogicalAnyJoin>,_true>::
           operator->((unique_ptr<duckdb::LogicalAnyJoin,_std::default_delete<duckdb::LogicalAnyJoin>,_true>
                       *)&local_28);
  Deserializer::
  ReadPropertyWithDefault<duckdb::unique_ptr<duckdb::Expression,std::default_delete<duckdb::Expression>,true>>
            (deserializer,0xcc,"condition",&pLVar1->condition);
  (this->super_LogicalJoin).super_LogicalOperator._vptr_LogicalOperator =
       (_func_int **)local_28._M_head_impl;
  return (unique_ptr<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>_>)
         (unique_ptr<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>_>)this;
}

Assistant:

unique_ptr<LogicalOperator> LogicalAnyJoin::Deserialize(Deserializer &deserializer) {
	auto join_type = deserializer.ReadProperty<JoinType>(200, "join_type");
	auto result = duckdb::unique_ptr<LogicalAnyJoin>(new LogicalAnyJoin(join_type));
	deserializer.ReadPropertyWithDefault<idx_t>(201, "mark_index", result->mark_index);
	deserializer.ReadPropertyWithDefault<vector<idx_t>>(202, "left_projection_map", result->left_projection_map);
	deserializer.ReadPropertyWithDefault<vector<idx_t>>(203, "right_projection_map", result->right_projection_map);
	deserializer.ReadPropertyWithDefault<unique_ptr<Expression>>(204, "condition", result->condition);
	return std::move(result);
}